

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLDHPrivateKey.cpp
# Opt level: O2

void __thiscall OSSLDHPrivateKey::OSSLDHPrivateKey(OSSLDHPrivateKey *this,DH *inDH)

{
  DHPrivateKey::DHPrivateKey(&this->super_DHPrivateKey);
  *(undefined ***)&this->super_DHPrivateKey = &PTR_serialise_0019d2f0;
  this->dh = (DH *)0x0;
  setFromOSSL(this,inDH);
  return;
}

Assistant:

OSSLDHPrivateKey::OSSLDHPrivateKey(const DH* inDH)
{
	dh = NULL;

	setFromOSSL(inDH);
}